

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void sptk::world::GetMinimumPhaseSpectrum(MinimumPhaseAnalysis *minimum_phase)

{
  int iVar1;
  double dVar2;
  double dVar3;
  fft_complex *padVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  fft_complex *padVar8;
  fft_complex *padVar9;
  fft_plan *pfVar10;
  undefined8 *puVar11;
  int i;
  byte bVar12;
  fft_plan in_stack_ffffffffffffff88;
  
  bVar12 = 0;
  iVar1 = minimum_phase->fft_size;
  uVar5 = (ulong)(iVar1 / 2);
  lVar6 = ~uVar5 + (long)iVar1;
  while (uVar5 = uVar5 + 1, (long)uVar5 < (long)iVar1) {
    minimum_phase->log_spectrum[uVar5] = minimum_phase->log_spectrum[lVar6];
    lVar6 = lVar6 + -1;
  }
  pfVar10 = &minimum_phase->inverse_fft;
  puVar11 = (undefined8 *)&stack0xffffffffffffff88;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar11 = *(undefined8 *)pfVar10;
    pfVar10 = (fft_plan *)&pfVar10->flags;
    puVar11 = puVar11 + 1;
  }
  fft_execute(in_stack_ffffffffffffff88);
  padVar9 = minimum_phase->cepstrum;
  (*padVar9)[1] = -(*padVar9)[1];
  iVar1 = minimum_phase->fft_size;
  lVar7 = (long)(iVar1 / 2);
  padVar4 = padVar9;
  for (lVar6 = 1; padVar8 = padVar4 + 1, lVar6 < lVar7; lVar6 = lVar6 + 1) {
    dVar2 = padVar4[1][1];
    (*padVar8)[0] = (*padVar8)[0] * 2.0;
    padVar4[1][1] = dVar2 * -2.0;
    padVar4 = padVar8;
  }
  padVar9 = padVar9 + lVar7;
  (*padVar9)[1] = -(*padVar9)[1];
  while( true ) {
    lVar7 = lVar7 + 1;
    if (iVar1 <= lVar7) break;
    padVar9[1][0] = 0.0;
    padVar9[1][1] = 0.0;
    padVar9 = padVar9 + 1;
  }
  pfVar10 = &minimum_phase->forward_fft;
  puVar11 = (undefined8 *)&stack0xffffffffffffff88;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar11 = *(undefined8 *)pfVar10;
    pfVar10 = (fft_plan *)((long)pfVar10 + (ulong)bVar12 * -0x10 + 8);
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  fft_execute(in_stack_ffffffffffffff88);
  lVar6 = 0;
  for (lVar7 = 0; lVar7 <= minimum_phase->fft_size / 2; lVar7 = lVar7 + 1) {
    dVar2 = exp(*(double *)((long)*minimum_phase->minimum_phase_spectrum + lVar6) /
                (double)minimum_phase->fft_size);
    dVar3 = cos(*(double *)((long)*minimum_phase->minimum_phase_spectrum + lVar6 + 8) /
                (double)minimum_phase->fft_size);
    padVar9 = minimum_phase->minimum_phase_spectrum;
    *(double *)((long)*padVar9 + lVar6) = dVar3 * dVar2;
    dVar3 = sin(*(double *)((long)*padVar9 + lVar6 + 8) / (double)minimum_phase->fft_size);
    *(double *)((long)*minimum_phase->minimum_phase_spectrum + lVar6 + 8) = dVar3 * dVar2;
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

void GetMinimumPhaseSpectrum(const MinimumPhaseAnalysis *minimum_phase) {
  // Mirroring
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i)
    minimum_phase->log_spectrum[i] =
    minimum_phase->log_spectrum[minimum_phase->fft_size - i];

  // This fft_plan carries out "forward" FFT.
  // To carriy out the Inverse FFT, the sign of imaginary part
  // is inverted after FFT.
  fft_execute(minimum_phase->inverse_fft);
  minimum_phase->cepstrum[0][1] *= -1.0;
  for (int i = 1; i < minimum_phase->fft_size / 2; ++i) {
    minimum_phase->cepstrum[i][0] *= 2.0;
    minimum_phase->cepstrum[i][1] *= -2.0;
  }
  minimum_phase->cepstrum[minimum_phase->fft_size / 2][1] *= -1.0;
  for (int i = minimum_phase->fft_size / 2 + 1;
      i < minimum_phase->fft_size; ++i) {
    minimum_phase->cepstrum[i][0] = 0.0;
    minimum_phase->cepstrum[i][1] = 0.0;
  }

  fft_execute(minimum_phase->forward_fft);

  // Since x is complex number, calculation of exp(x) is as following.
  // Note: This FFT library does not keep the aliasing.
  double tmp;
  for (int i = 0; i <= minimum_phase->fft_size / 2; ++i) {
    tmp = exp(minimum_phase->minimum_phase_spectrum[i][0] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][0] = tmp *
      cos(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
    minimum_phase->minimum_phase_spectrum[i][1] = tmp *
      sin(minimum_phase->minimum_phase_spectrum[i][1] /
      minimum_phase->fft_size);
  }
}